

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

int xmlDictGrow(xmlDictPtr dict,size_t size)

{
  xmlDictEntryPtr pxVar1;
  _xmlDictEntry *p_Var2;
  int iVar3;
  uint32_t uVar4;
  _xmlDictEntry *p_Var5;
  _xmlDictEntry *p_Var6;
  ulong uVar7;
  unsigned_long local_78;
  unsigned_long local_70;
  xmlDictEntryPtr entry;
  int keep_keys;
  int ret;
  _xmlDictEntry *olddict;
  xmlDictEntryPtr next;
  xmlDictEntryPtr iter;
  size_t i;
  size_t oldsize;
  unsigned_long okey;
  unsigned_long key;
  size_t size_local;
  xmlDictPtr dict_local;
  
  entry._4_4_ = 0;
  if (dict == (xmlDictPtr)0x0) {
    dict_local._4_4_ = -1;
  }
  else if (size < 8) {
    dict_local._4_4_ = -1;
  }
  else if (size < 0x4001) {
    pxVar1 = (xmlDictEntryPtr)dict->size;
    p_Var2 = dict->dict;
    if (p_Var2 == (_xmlDictEntry *)0x0) {
      dict_local._4_4_ = -1;
    }
    else {
      p_Var5 = (_xmlDictEntry *)(*xmlMalloc)(size << 5);
      dict->dict = p_Var5;
      if (dict->dict == (_xmlDictEntry *)0x0) {
        dict->dict = p_Var2;
        dict_local._4_4_ = -1;
      }
      else {
        memset(dict->dict,0,size << 5);
        dict->size = size;
        for (iter = (xmlDictEntryPtr)0x0; iter < pxVar1;
            iter = (xmlDictEntryPtr)((long)&iter->next + 1)) {
          if (p_Var2[(long)iter].valid != 0) {
            if (pxVar1 == (xmlDictEntryPtr)0x80) {
              if (dict->size == 0x80) {
                local_70 = xmlDictComputeFastKey
                                     (p_Var2[(long)iter].name,p_Var2[(long)iter].len,dict->seed);
              }
              else {
                uVar4 = xmlDictComputeBigKey
                                  (p_Var2[(long)iter].name,p_Var2[(long)iter].len,dict->seed);
                local_70 = (unsigned_long)uVar4;
              }
              oldsize = local_70;
            }
            else {
              oldsize = p_Var2[(long)iter].okey;
            }
            uVar7 = oldsize % dict->size;
            if (dict->dict[uVar7].valid == 0) {
              p_Var5 = dict->dict + uVar7;
              p_Var6 = p_Var2 + (long)iter;
              p_Var5->next = p_Var6->next;
              p_Var5->name = p_Var6->name;
              iVar3 = p_Var6->valid;
              p_Var5->len = p_Var6->len;
              p_Var5->valid = iVar3;
              p_Var5->okey = p_Var6->okey;
              dict->dict[uVar7].next = (_xmlDictEntry *)0x0;
              dict->dict[uVar7].okey = oldsize;
            }
            else {
              p_Var5 = (_xmlDictEntry *)(*xmlMalloc)(0x20);
              if (p_Var5 == (_xmlDictEntry *)0x0) {
                entry._4_4_ = -1;
              }
              else {
                p_Var5->name = p_Var2[(long)iter].name;
                p_Var5->len = p_Var2[(long)iter].len;
                p_Var5->okey = oldsize;
                p_Var5->next = dict->dict[uVar7].next;
                p_Var5->valid = 1;
                dict->dict[uVar7].next = p_Var5;
              }
            }
          }
        }
        for (iter = (xmlDictEntryPtr)0x0; iter < pxVar1;
            iter = (xmlDictEntryPtr)((long)&iter->next + 1)) {
          next = p_Var2[(long)iter].next;
          while (next != (xmlDictEntryPtr)0x0) {
            p_Var5 = next->next;
            if (pxVar1 == (xmlDictEntryPtr)0x80) {
              if (dict->size == 0x80) {
                local_78 = xmlDictComputeFastKey(next->name,next->len,dict->seed);
              }
              else {
                uVar4 = xmlDictComputeBigKey(next->name,next->len,dict->seed);
                local_78 = (unsigned_long)uVar4;
              }
              oldsize = local_78;
            }
            else {
              oldsize = next->okey;
            }
            uVar7 = oldsize % dict->size;
            if (dict->dict[uVar7].valid == 0) {
              p_Var6 = dict->dict + uVar7;
              p_Var6->next = next->next;
              p_Var6->name = next->name;
              iVar3 = next->valid;
              p_Var6->len = next->len;
              p_Var6->valid = iVar3;
              p_Var6->okey = next->okey;
              dict->dict[uVar7].next = (_xmlDictEntry *)0x0;
              dict->dict[uVar7].valid = 1;
              dict->dict[uVar7].okey = oldsize;
              (*xmlFree)(next);
              next = p_Var5;
            }
            else {
              next->next = dict->dict[uVar7].next;
              next->okey = oldsize;
              dict->dict[uVar7].next = next;
              next = p_Var5;
            }
          }
        }
        (*xmlFree)(p_Var2);
        dict_local._4_4_ = entry._4_4_;
      }
    }
  }
  else {
    dict_local._4_4_ = -1;
  }
  return dict_local._4_4_;
}

Assistant:

static int
xmlDictGrow(xmlDictPtr dict, size_t size) {
    unsigned long key, okey;
    size_t oldsize, i;
    xmlDictEntryPtr iter, next;
    struct _xmlDictEntry *olddict;
#ifdef DEBUG_GROW
    unsigned long nbElem = 0;
#endif
    int ret = 0;
    int keep_keys = 1;

    if (dict == NULL)
	return(-1);
    if (size < 8)
        return(-1);
    if (size > 8 * 2048)
	return(-1);

#ifdef DICT_DEBUG_PATTERNS
    fprintf(stderr, "*");
#endif

    oldsize = dict->size;
    olddict = dict->dict;
    if (olddict == NULL)
        return(-1);
    if (oldsize == MIN_DICT_SIZE)
        keep_keys = 0;

    dict->dict = xmlMalloc(size * sizeof(xmlDictEntry));
    if (dict->dict == NULL) {
	dict->dict = olddict;
	return(-1);
    }
    memset(dict->dict, 0, size * sizeof(xmlDictEntry));
    dict->size = size;

    /*	If the two loops are merged, there would be situations where
	a new entry needs to allocated and data copied into it from
	the main dict. It is nicer to run through the array twice, first
	copying all the elements in the main array (less probability of
	allocate) and then the rest, so we only free in the second loop.
    */
    for (i = 0; i < oldsize; i++) {
	if (olddict[i].valid == 0)
	    continue;

	if (keep_keys)
	    okey = olddict[i].okey;
	else
	    okey = xmlDictComputeKey(dict, olddict[i].name, olddict[i].len);
	key = okey % dict->size;

	if (dict->dict[key].valid == 0) {
	    memcpy(&(dict->dict[key]), &(olddict[i]), sizeof(xmlDictEntry));
	    dict->dict[key].next = NULL;
	    dict->dict[key].okey = okey;
	} else {
	    xmlDictEntryPtr entry;

	    entry = xmlMalloc(sizeof(xmlDictEntry));
	    if (entry != NULL) {
		entry->name = olddict[i].name;
		entry->len = olddict[i].len;
		entry->okey = okey;
		entry->next = dict->dict[key].next;
		entry->valid = 1;
		dict->dict[key].next = entry;
	    } else {
	        /*
		 * we don't have much ways to alert from here
		 * result is losing an entry and unicity guarantee
		 */
	        ret = -1;
	    }
	}
#ifdef DEBUG_GROW
	nbElem++;
#endif
    }

    for (i = 0; i < oldsize; i++) {
	iter = olddict[i].next;
	while (iter) {
	    next = iter->next;

	    /*
	     * put back the entry in the new dict
	     */

	    if (keep_keys)
		okey = iter->okey;
	    else
		okey = xmlDictComputeKey(dict, iter->name, iter->len);
	    key = okey % dict->size;
	    if (dict->dict[key].valid == 0) {
		memcpy(&(dict->dict[key]), iter, sizeof(xmlDictEntry));
		dict->dict[key].next = NULL;
		dict->dict[key].valid = 1;
		dict->dict[key].okey = okey;
		xmlFree(iter);
	    } else {
		iter->next = dict->dict[key].next;
		iter->okey = okey;
		dict->dict[key].next = iter;
	    }

#ifdef DEBUG_GROW
	    nbElem++;
#endif

	    iter = next;
	}
    }

    xmlFree(olddict);

#ifdef DEBUG_GROW
    xmlGenericError(xmlGenericErrorContext,
	    "xmlDictGrow : from %lu to %lu, %u elems\n", oldsize, size, nbElem);
#endif

    return(ret);
}